

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O0

int CFITS2Unit(fitsfile *fptr)

{
  int local_1c;
  fitsfile *pfStack_18;
  int status;
  fitsfile *fptr_local;
  
  local_1c = 0;
  if ((CFITS2Unit::last_unit == 0) || (fptr != gFitsFiles[CFITS2Unit::last_unit])) {
    for (CFITS2Unit::last_unit = 1; CFITS2Unit::last_unit < 10000;
        CFITS2Unit::last_unit = CFITS2Unit::last_unit + 1) {
      if (fptr == gFitsFiles[CFITS2Unit::last_unit]) {
        CFITS2Unit::last_fptr = fptr;
        return CFITS2Unit::last_unit;
      }
    }
    CFITS2Unit::last_fptr = fptr;
    pfStack_18 = fptr;
    Cffgiou(&CFITS2Unit::last_unit,&local_1c);
    if (local_1c == 0) {
      gFitsFiles[CFITS2Unit::last_unit] = pfStack_18;
    }
    else {
      CFITS2Unit::last_unit = 0;
    }
    fptr_local._4_4_ = CFITS2Unit::last_unit;
  }
  else {
    fptr_local._4_4_ = CFITS2Unit::last_unit;
  }
  CFITS2Unit::last_unit = fptr_local._4_4_;
  return fptr_local._4_4_;
}

Assistant:

int CFITS2Unit( fitsfile *fptr )
     /* Utility routine to convert a fitspointer to a Fortran unit number */
     /* for use when a C program is calling a Fortran routine which could */
     /* in turn call CFITSIO... Modelled after code by Ning Gan.          */
{
   static fitsfile *last_fptr = (fitsfile *)NULL; /* Remember last fptr */
   static int last_unit = 0;                      /* Remember last unit */
   int status = 0;

   /*  Test whether we are repeating the last lookup  */

   if( last_unit && fptr==gFitsFiles[last_unit] )
      return( last_unit );

   /*  Check if gFitsFiles has an entry for this fptr.  */
   /*  Allows Fortran to call C to call Fortran to      */
   /*  call CFITSIO... OUCH!!!                          */

   last_fptr = fptr;
   for( last_unit=1; last_unit<NMAXFILES; last_unit++ ) {
      if( fptr == gFitsFiles[last_unit] )
	 return( last_unit );
   }

   /*  Allocate a new unit number for this fptr  */
   Cffgiou( &last_unit, &status );
   if( status )
      last_unit = 0;
   else
      gFitsFiles[last_unit] = fptr;
   return( last_unit );
}